

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O3

void ARKodeSPRKTable_Write(ARKodeSPRKTable sprk_table,FILE *outfile)

{
  ARKodeButcherTable B;
  ARKodeButcherTable B_00;
  ARKodeButcherTable b;
  ARKodeButcherTable a;
  ARKodeButcherTable local_28;
  ARKodeButcherTable local_20;
  
  local_20 = (ARKodeButcherTable)0x0;
  local_28 = (ARKodeButcherTable)0x0;
  ARKodeSPRKTable_ToButcher(sprk_table,&local_20,&local_28);
  B_00 = local_20;
  ARKodeButcherTable_Write(local_20,outfile);
  B = local_28;
  ARKodeButcherTable_Write(local_28,outfile);
  ARKodeButcherTable_Free(B_00);
  ARKodeButcherTable_Free(B);
  return;
}

Assistant:

void ARKodeSPRKTable_Write(ARKodeSPRKTable sprk_table, FILE* outfile)
{
  ARKodeButcherTable a = NULL;
  ARKodeButcherTable b = NULL;

  ARKodeSPRKTable_ToButcher(sprk_table, &a, &b);

  ARKodeButcherTable_Write(a, outfile);
  ARKodeButcherTable_Write(b, outfile);

  ARKodeButcherTable_Free(a);
  ARKodeButcherTable_Free(b);
}